

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_free(ps_decoder_t *ps)

{
  int iVar1;
  ps_decoder_t *ps_local;
  
  if (ps == (ps_decoder_t *)0x0) {
    ps_local._4_4_ = 0;
  }
  else {
    iVar1 = ps->refcount + -1;
    ps->refcount = iVar1;
    if (iVar1 < 1) {
      ps_free_searches(ps);
      dict_free(ps->dict);
      dict2pid_free(ps->d2p);
      acmod_free(ps->acmod);
      logmath_free(ps->lmath);
      ps_config_free(ps->config);
      ckd_free(ps);
      ps_local._4_4_ = 0;
    }
    else {
      ps_local._4_4_ = ps->refcount;
    }
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_free(ps_decoder_t *ps)
{
    if (ps == NULL)
        return 0;
    if (--ps->refcount > 0)
        return ps->refcount;
    ps_free_searches(ps);
    dict_free(ps->dict);
    dict2pid_free(ps->d2p);
    acmod_free(ps->acmod);
    logmath_free(ps->lmath);
    ps_config_free(ps->config);
    ckd_free(ps);
    return 0;
}